

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

void __thiscall kj::Path::Path(Path *this,ArrayPtr<const_kj::StringPtr> parts)

{
  String *pSVar1;
  size_t count;
  StringPtr *pSVar2;
  long lVar3;
  StringPtr value;
  ArrayBuilder<kj::String> builder;
  Array<char> local_58;
  Array<kj::String> local_38;
  
  count = parts.size_;
  pSVar2 = parts.ptr;
  builder.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::String>(count);
  pSVar1 = builder.ptr + count;
  builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  builder.pos = builder.ptr;
  builder.endPtr = pSVar1;
  for (lVar3 = count << 4; lVar3 != 0; lVar3 = lVar3 + -0x10) {
    value.content.size_ = (size_t)pSVar1;
    value.content.ptr = (char *)(pSVar2->content).size_;
    heapString((String *)&local_58,(kj *)(pSVar2->content).ptr,value);
    ((builder.pos)->content).ptr = local_58.ptr;
    ((builder.pos)->content).size_ = local_58.size_;
    ((builder.pos)->content).disposer = local_58.disposer;
    local_58.ptr = (char *)0x0;
    local_58.size_ = 0;
    builder.pos = builder.pos + 1;
    pSVar1 = (String *)local_58.disposer;
    Array<char>::~Array(&local_58);
    pSVar2 = pSVar2 + 1;
  }
  local_38.size_ = ((long)builder.pos - (long)builder.ptr) / 0x18;
  local_38.ptr = builder.ptr;
  local_38.disposer = builder.disposer;
  builder.ptr = (String *)0x0;
  builder.pos = (RemoveConst<kj::String> *)0x0;
  builder.endPtr = (String *)0x0;
  ArrayBuilder<kj::String>::dispose(&builder);
  Path(this,&local_38);
  Array<kj::String>::~Array(&local_38);
  return;
}

Assistant:

Path::Path(ArrayPtr<const StringPtr> parts)
    : Path(KJ_MAP(p, parts) { return heapString(p); }) {}